

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_SubDMeshFragmentIterator::BoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragmentIterator *this)

{
  ON_SubDComponentLocation OVar1;
  
  OVar1 = SubDAppearance(this);
  if (OVar1 == ControlNet) {
    ControlNetQuadBoundingBox(__return_storage_ptr__,this);
  }
  else {
    SurfaceBoundingBox(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragmentIterator::BoundingBox() const
{
  return
    (ON_SubDComponentLocation::ControlNet == SubDAppearance())
    ? ControlNetQuadBoundingBox()
    : SurfaceBoundingBox();
}